

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_string_length(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  float fVar1;
  int iVar2;
  lyxp_set *plVar3;
  ushort *puVar4;
  ly_bool lVar5;
  LY_ERR ret__;
  LY_ERR LVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  char *format;
  long lVar10;
  undefined4 uVar11;
  ly_ctx *ctx;
  
  if ((options & 0x1c) == 0) {
    if (arg_count == 0) {
      LVar6 = lyxp_set_cast(set,LYXP_SET_STRING);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      sVar7 = strlen((set->val).str);
    }
    else {
      LVar6 = lyxp_set_cast(*args,LYXP_SET_STRING);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      sVar7 = strlen(((*args)->val).str);
    }
    fVar1 = *(float *)(&DAT_001da928 + (ulong)((long)sVar7 < 0) * 4);
    lyxp_set_free_content(set);
    set->type = LYXP_SET_NUMBER;
    (set->val).num = (longdouble)(long)sVar7 + (longdouble)fVar1;
  }
  else {
    if (arg_count == 0) {
      if (set->type == LYXP_SET_SCNODE_SET) {
        uVar9 = set->used;
        do {
          uVar9 = uVar9 - 1;
          if (*(int *)((long)(set->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
            puVar4 = *(ushort **)((long)(set->val).nodes + (ulong)uVar9 * 0x18);
            if (puVar4 != (ushort *)0x0) {
              if ((*puVar4 & 0xc) == 0) {
                ctx = set->ctx;
                pcVar8 = lys_nodetype2str(*puVar4);
                format = "Argument #0 of %s is a %s node \"%s\".";
                goto LAB_001b2d43;
              }
              lVar5 = warn_is_string_type(*(lysc_type **)(puVar4 + 0x30));
              if (lVar5 == '\0') {
                ctx = set->ctx;
                pcVar8 = *(char **)(puVar4 + 0x14);
                format = "Argument #0 of %s is node \"%s\", not of string-type.";
                goto LAB_001b2d43;
              }
            }
            break;
          }
        } while (uVar9 != 0);
      }
    }
    else {
      plVar3 = *args;
      if (plVar3->type == LYXP_SET_SCNODE_SET) {
        uVar9 = plVar3->used;
        do {
          uVar9 = uVar9 - 1;
          if (*(int *)((long)(plVar3->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
            puVar4 = *(ushort **)((long)(plVar3->val).nodes + (ulong)uVar9 * 0x18);
            if (puVar4 != (ushort *)0x0) {
              if ((*puVar4 & 0xc) == 0) {
                ctx = set->ctx;
                pcVar8 = lys_nodetype2str(*puVar4);
                format = "Argument #1 of %s is a %s node \"%s\".";
                goto LAB_001b2d43;
              }
              lVar5 = warn_is_string_type(*(lysc_type **)(puVar4 + 0x30));
              if (lVar5 == '\0') {
                ctx = set->ctx;
                pcVar8 = *(char **)(puVar4 + 0x14);
                format = "Argument #1 of %s is node \"%s\", not of string-type.";
LAB_001b2d43:
                ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_string_length",pcVar8);
              }
            }
            break;
          }
        } while (uVar9 != 0);
      }
    }
    uVar9 = set->used;
    if ((ulong)uVar9 != 0) {
      lVar10 = 0;
      do {
        iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar10);
        if (iVar2 == 2) {
          uVar11 = 1;
LAB_001b2d7a:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = uVar11;
        }
        else if (iVar2 == -2) {
          uVar11 = 0xffffffff;
          goto LAB_001b2d7a;
        }
        lVar10 = lVar10 + 0x18;
      } while ((ulong)uVar9 * 0x18 != lVar10);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_string_length(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        rc = lyxp_set_cast(set, LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(set->val.str));
    }

    return LY_SUCCESS;
}